

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

void chaiscript::utility::add_class<chaiscript::parser::ChaiScript_Parser,chaiscript::Module>
               (Module *t_module,string *t_class_name,
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               *t_constructors,
               vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *t_funcs)

{
  pointer pcVar1;
  pointer psVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer psVar5;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c0;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Type_Info local_48;
  
  pcVar1 = (t_class_name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + t_class_name->_M_string_length);
  local_48.m_type_info = (type_info *)&parser::ChaiScript_Parser::typeinfo;
  local_48.m_bare_type_info = (type_info *)&parser::ChaiScript_Parser::typeinfo;
  local_48.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)t_module,&local_48,&local_68);
  local_b0 = t_funcs;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  psVar5 = (t_constructors->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (t_constructors->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar2) {
    do {
      local_c0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (psVar5->
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      local_c0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar5->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_c0.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c0.
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_c0.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c0.
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_c0.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pcVar1 = (t_class_name->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + t_class_name->_M_string_length);
      std::
      vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
      ::
      emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
                ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
                  *)&t_module->m_funcs,&local_c0,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_c0.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar2);
  }
  ppVar4 = (local_b0->
           super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (local_b0->
           super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar3) {
    do {
      local_d0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (ppVar4->first).
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_d0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (ppVar4->first).
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_d0.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d0.
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_d0.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d0.
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_d0.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pcVar1 = (ppVar4->second)._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,pcVar1 + (ppVar4->second)._M_string_length);
      std::
      vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
      ::
      emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
                ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
                  *)&t_module->m_funcs,&local_d0,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_d0.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar3);
  }
  return;
}

Assistant:

void add_class(ModuleType &t_module,
          const std::string &t_class_name,
          const std::vector<chaiscript::Proxy_Function> &t_constructors,
          const std::vector<std::pair<chaiscript::Proxy_Function, std::string>> &t_funcs)
      {
        t_module.add(chaiscript::user_type<Class>(), t_class_name); 

        for(const chaiscript::Proxy_Function &ctor: t_constructors)
        {
          t_module.add(ctor, t_class_name);
        }

        for(const auto &fun: t_funcs)
        {
          t_module.add(fun.first, fun.second);
        }
      }